

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O0

void __thiscall YinYang::YinYang(YinYang *this,double radius)

{
  double radius_local;
  YinYang *this_local;
  
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00108d00;
  std::__cxx11::string::operator=((string *)&(this->super_Parameterization).name,"YinYang");
  (this->super_Parameterization).Jmax = 0x78;
  (this->super_Parameterization).Kmax = 0x3c;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 2;
  this->theta1_lb = 0.7853981633974483;
  this->theta1_ub = 5.497787143782138;
  this->d_theta1 =
       (this->theta1_ub - this->theta1_lb) / (double)((this->super_Parameterization).Jmax + -1);
  this->theta2_lb = 0.6283185307179586;
  this->theta2_ub = 2.5132741228718345;
  this->d_theta2 =
       (this->theta2_ub - this->theta2_lb) / (double)((this->super_Parameterization).Kmax + -1);
  return;
}

Assistant:

YinYang::YinYang(double radius) : Parameterization(radius) {
  name = "YinYang";

  Jmax = 120;
  Kmax = 60;
  Lmax = 1;
  Gmax = 2;

  // Angle in the xy-plane
  theta1_lb = (1.0e0 / 4.0e0) * PI;
  theta1_ub = (7.0e0 / 4.0e0) * PI;
  //theta1_lb = -(3.0e0 / 4.0e0) * PI;
  //theta1_ub = (3.0e0 / 4.0e0) * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1);

  // Angle between positive z-axis and radius.
  //theta2_lb = (1.0e0 / 4.0e0) * PI;
  //theta2_ub = (3.0e0 / 4.0e0) * PI;
  theta2_lb = (1.0e0 / 5.0e0) * PI;
  theta2_ub = (4.0e0 / 5.0e0) * PI;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1);
}